

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

void testExistingStreamsUTF8(string *tempDir)

{
  int iVar1;
  ostream *this;
  char *pcVar2;
  Rgba *pRVar3;
  float fVar4;
  float fVar5;
  int x;
  int y;
  Array2D<Imf_3_4::Rgba> p2;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in;
  RgbaOutputFile out;
  Header header;
  string outfn;
  Array2D<Imf_3_4::Rgba> p1;
  int H;
  int W;
  undefined4 in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  undefined8 in_stack_fffffffffffffe38;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  long in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffe80;
  int local_128;
  int local_124;
  Array2D<Imf_3_4::Rgba> local_120;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int *local_f8;
  Rgba local_f0 [8];
  Rgba local_b0 [3];
  Vec2<float> local_98;
  Header local_90 [56];
  string local_58 [48];
  Array2D<Imf_3_4::Rgba> local_28;
  undefined4 local_10;
  undefined4 local_c;
  
  this = std::operator<<((ostream *)&std::cout,"Testing reading and writing using existing streams")
  ;
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_c = 0x77;
  local_10 = 0xed;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,in_stack_fffffffffffffe70);
  anon_unknown.dwarf_f3d98::fillPixels1
            (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
             (int)in_stack_fffffffffffffe38);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::operator<<((ostream *)&std::cout,"writing");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  Imath_3_2::Vec2<float>::Vec2(&local_98,0.0,0.0);
  Imf_3_4::Header::Header(local_90,0x77,0xed,1.0,(Vec2 *)&local_98,1.0,INCREASING_Y,NO_COMPRESSION);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_b0,pcVar2,local_90,WRITE_RGBA,iVar1);
  pRVar3 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_28,0);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_b0,(ulong)pRVar3,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_b0);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_b0);
  Imf_3_4::Header::~Header(local_90);
  std::operator<<((ostream *)&std::cout,", reading");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_f0,pcVar2,iVar1);
  local_f8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  local_fc = (local_f8[2] - *local_f8) + 1;
  local_100 = (local_f8[3] - local_f8[1]) + 1;
  local_104 = *local_f8;
  local_108 = local_f8[1];
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,in_stack_fffffffffffffe70);
  pRVar3 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_120,(long)-local_108);
  Imf_3_4::RgbaInputFile::setFrameBuffer(local_f0,(ulong)(pRVar3 + -local_104),1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_f0,local_f8[1]);
  std::operator<<((ostream *)&std::cout,", comparing");
  local_124 = 0;
  do {
    if (local_100 <= local_124) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                ((Array2D<Imf_3_4::Rgba> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_f0);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      remove(pcVar2);
      std::__cxx11::string::~string(local_58);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                ((Array2D<Imf_3_4::Rgba> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      return;
    }
    for (local_128 = 0; local_128 < local_fc; local_128 = local_128 + 1) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_120,(long)local_124);
      fVar4 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_28,(long)local_124);
      fVar5 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
        __assert_fail("p2[y][x].r == p1[y][x].r",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x470,"void testExistingStreamsUTF8(const std::string &)");
      }
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_120,(long)local_124);
      fVar4 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_28,(long)local_124);
      fVar5 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
        __assert_fail("p2[y][x].g == p1[y][x].g",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x471,"void testExistingStreamsUTF8(const std::string &)");
      }
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_120,(long)local_124);
      fVar4 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_28,(long)local_124);
      fVar5 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
        __assert_fail("p2[y][x].b == p1[y][x].b",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x472,"void testExistingStreamsUTF8(const std::string &)");
      }
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_120,(long)local_124);
      in_stack_fffffffffffffe34 =
           Imath_3_2::half::operator_cast_to_float
                     ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_28,(long)local_124);
      fVar4 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if ((in_stack_fffffffffffffe34 != fVar4) || (NAN(in_stack_fffffffffffffe34) || NAN(fVar4))) {
        __assert_fail("p2[y][x].a == p1[y][x].a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x473,"void testExistingStreamsUTF8(const std::string &)");
      }
    }
    local_124 = local_124 + 1;
  } while( true );
}

Assistant:

void
testExistingStreamsUTF8 (const std::string& tempDir)
{

    cout << "Testing reading and writing using existing streams" << endl;

    const int W = 119;
    const int H = 237;
    Array2D<Rgba> p1 (H, W);

    fillPixels1 (p1, W, H);

    // per google translate, image in Japanese
    std::string   outfn = tempDir + "画像.exr";

    {
        cout << "writing";
#ifdef _WIN32
        _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
        remove (outfn.c_str ());
#endif
        Header      header (
            W,
            H,
            1,
            IMATH_NAMESPACE::V2f (0, 0),
            1,
            INCREASING_Y,
            NO_COMPRESSION);

        RgbaOutputFile out (
            outfn.c_str (),
            header,
            WRITE_RGBA);

        out.setFrameBuffer (&p1[0][0], 1, W);
        out.writePixels (H);
    }

    {
        cout << ", reading";
        RgbaInputFile in (outfn.c_str ());
        const Box2i& dw = in.dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        cout << ", comparing";
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (p2[y][x].r == p1[y][x].r);
                assert (p2[y][x].g == p1[y][x].g);
                assert (p2[y][x].b == p1[y][x].b);
                assert (p2[y][x].a == p1[y][x].a);
            }
        }
    }

    cout << endl;

#ifdef _WIN32
    _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
    remove (outfn.c_str ());
#endif
}